

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tl.cpp
# Opt level: O1

bool __thiscall pg::TLSolver::extractTangles(TLSolver *this,int startvertex,bitset *R,int *str)

{
  pointer *pppiVar1;
  ulong *puVar2;
  vector<int,std::allocator<int>> *this_00;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  Game *pGVar7;
  iterator iVar8;
  int *piVar9;
  uint64_t *puVar10;
  uint64_t *puVar11;
  uint64_t *puVar12;
  uint64_t *puVar13;
  ulong uVar14;
  size_t sVar15;
  iterator iVar16;
  iterator __position;
  pointer piVar17;
  char cVar18;
  bool bVar19;
  bool bVar20;
  iterator __begin3;
  int *piVar21;
  ostream *poVar22;
  byte bVar23;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  int *piVar28;
  long lVar29;
  int iVar30;
  long lVar31;
  int to;
  iterator __end2;
  uint *puVar32;
  iterator __begin2;
  int pr;
  int *_tout;
  int tidx;
  vector<int,_std::allocator<int>_> *__range2;
  int *_vv;
  int local_94;
  _label_vertex local_90;
  int *local_80;
  int local_74;
  int local_70;
  uint local_6c;
  vector<int,std::allocator<int>> *local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_60;
  vector<int*,std::allocator<int*>> *local_58;
  vector<int*,std::allocator<int*>> *local_50;
  vector<int,std::allocator<int>> *local_48;
  bitset *local_40;
  int *local_38;
  
  uVar25 = (ulong)startvertex;
  local_94 = ((this->super_Solver).game)->_priority[uVar25];
  puVar6 = (this->pea_state).queue;
  iVar24 = (this->pea_state).pointer;
  (this->pea_state).pointer = iVar24 + 1;
  puVar6[iVar24] = startvertex;
  iVar24 = (this->pea_state).pointer;
  (this->pea_state).pointer = iVar24 + 1;
  puVar6[iVar24] = 0;
  puVar2 = (this->pea_root)._bits + (uVar25 >> 6);
  *puVar2 = *puVar2 | 1L << (uVar25 & 0x3f);
  uVar3 = this->pea_curidx;
  this->pea_curidx = uVar3 + 1;
  this->pea_vidx[uVar25] = uVar3;
  if ((this->pea_state).pointer == 0) {
    bVar20 = false;
  }
  else {
    local_68 = (vector<int,std::allocator<int>> *)&this->tangle;
    local_48 = (vector<int,std::allocator<int>> *)&this->tpr;
    local_50 = (vector<int*,std::allocator<int*>> *)&this->tout;
    local_58 = (vector<int*,std::allocator<int*>> *)&this->tv;
    local_60 = &this->tescs;
    bVar20 = false;
    local_80 = str;
    local_74 = local_94;
    local_40 = R;
    do {
      pGVar7 = (this->super_Solver).game;
      puVar6 = (this->pea_state).queue;
      lVar29 = (long)(this->pea_state).pointer;
      uVar3 = puVar6[lVar29 + -2];
      uVar25 = (ulong)uVar3;
      uVar27 = puVar6[lVar29 + -1];
      bVar23 = (byte)uVar3;
      if (((((pGVar7->_owner)._bits[(ulong)(long)(int)uVar3 >> 6] >> (uVar25 & 0x3f) & 1) == 0 ^
           (byte)local_74) & 1) == 0) {
        iVar24 = pGVar7->_firstouts[(int)uVar3];
        piVar21 = pGVar7->_outedges;
        if (uVar27 != 0) {
          puVar32 = this->pea_vidx;
          if (puVar32[piVar21[(long)iVar24 + (ulong)(uVar27 - 1)]] < puVar32[uVar25]) {
            puVar32[uVar25] = puVar32[piVar21[(long)iVar24 + (ulong)(uVar27 - 1)]];
            puVar2 = (this->pea_root)._bits + (uVar3 >> 6);
            *puVar2 = *puVar2 & (-2L << (bVar23 & 0x3f) |
                                0xfffffffffffffffeU >> 0x40 - (bVar23 & 0x3f));
          }
        }
        puVar10 = local_40->_bits;
        puVar32 = this->pea_vidx;
        puVar11 = (this->pea_root)._bits;
        do {
          uVar4 = piVar21[(long)iVar24 + (ulong)uVar27];
          uVar26 = (ulong)(int)uVar4;
          if (uVar26 == 0xffffffffffffffff) {
            iVar30 = 5;
          }
          else {
            if ((puVar10[uVar26 >> 6] >> (uVar26 & 0x3f) & 1) != 0) {
              uVar5 = puVar32[uVar26];
              if (uVar5 == 0) {
                puVar6[(long)(this->pea_state).pointer + -1] = uVar27 + 1;
                iVar30 = (this->pea_state).pointer;
                (this->pea_state).pointer = iVar30 + 1;
                puVar6[iVar30] = uVar4;
                iVar30 = (this->pea_state).pointer;
                (this->pea_state).pointer = iVar30 + 1;
                puVar6[iVar30] = 0;
                puVar2 = puVar11 + (uVar26 >> 6);
                *puVar2 = *puVar2 | 1L << (uVar26 & 0x3f);
                uVar5 = this->pea_curidx;
                this->pea_curidx = uVar5 + 1;
                puVar32[uVar26] = uVar5;
                iVar30 = 4;
                str = local_80;
                goto LAB_0016b2c6;
              }
              if (uVar5 < puVar32[uVar25]) {
                puVar32[uVar25] = uVar5;
                puVar2 = puVar11 + (uVar3 >> 6);
                *puVar2 = *puVar2 & (-2L << (bVar23 & 0x3f) |
                                    0xfffffffffffffffeU >> 0x40 - (bVar23 & 0x3f));
              }
            }
            uVar27 = uVar27 + 1;
            iVar30 = 0;
          }
LAB_0016b2c6:
        } while (iVar30 == 0);
        if (iVar30 == 5) {
          iVar30 = 0;
        }
        if (iVar30 == 0) goto LAB_0016b349;
      }
      else {
        uVar4 = str[uVar25];
        uVar26 = (ulong)(int)uVar4;
        if ((uVar27 == 0) && (puVar32 = this->pea_vidx, puVar32[uVar26] == 0)) {
          puVar6[lVar29 + -1] = 1;
          iVar24 = (this->pea_state).pointer;
          (this->pea_state).pointer = iVar24 + 1;
          puVar6[iVar24] = uVar4;
          iVar24 = (this->pea_state).pointer;
          (this->pea_state).pointer = iVar24 + 1;
          puVar6[iVar24] = 0;
          puVar2 = (this->pea_root)._bits + (uVar26 >> 6);
          *puVar2 = *puVar2 | 1L << (uVar26 & 0x3f);
          uVar27 = this->pea_curidx;
          this->pea_curidx = uVar27 + 1;
          puVar32[uVar26] = uVar27;
          iVar30 = 4;
          bVar19 = false;
        }
        else {
          puVar32 = this->pea_vidx;
          bVar19 = true;
          iVar30 = 0;
          if (puVar32[uVar26] < puVar32[uVar25]) {
            puVar32[uVar25] = puVar32[uVar26];
            puVar2 = (this->pea_root)._bits + (uVar3 >> 6);
            *puVar2 = *puVar2 & (-2L << (bVar23 & 0x3f) |
                                0xfffffffffffffffeU >> 0x40 - (bVar23 & 0x3f));
            iVar30 = 0;
          }
        }
        if (bVar19) {
LAB_0016b349:
          piVar21 = &(this->pea_state).pointer;
          *piVar21 = *piVar21 + -2;
          if (((this->pea_root)._bits[uVar3 >> 6] >> (uVar25 & 0x3f) & 1) == 0) {
            iVar24 = (this->pea_S).pointer;
            (this->pea_S).pointer = iVar24 + 1;
            (this->pea_S).queue[iVar24] = uVar3;
            iVar30 = 2;
          }
          else {
            this->pea_curidx = this->pea_curidx + -1;
            local_90.g = (Game *)CONCAT44(local_90.g._4_4_,uVar3);
            iVar8._M_current =
                 (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar8._M_current ==
                (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)local_68,iVar8,(int *)&local_90);
            }
            else {
              *iVar8._M_current = uVar3;
              (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar8._M_current + 1;
            }
            do {
              iVar24 = (this->pea_S).pointer;
              if ((long)iVar24 == 0) break;
              uVar4 = (this->pea_S).queue[(long)iVar24 + -1];
              local_90.g = (Game *)CONCAT44(local_90.g._4_4_,uVar4);
              puVar32 = this->pea_vidx;
              uVar27 = puVar32[uVar25];
              uVar5 = puVar32[(int)uVar4];
              if (uVar5 < uVar27) break;
              (this->pea_S).pointer = iVar24 + -1;
              this->pea_curidx = this->pea_curidx + -1;
              puVar32[(int)uVar4] = 0xffffffff;
              iVar8._M_current =
                   (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar8._M_current ==
                  (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (local_68,iVar8,(int *)&local_90);
              }
              else {
                *iVar8._M_current = uVar4;
                (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar8._M_current + 1;
              }
            } while (uVar27 <= uVar5);
            this->pea_vidx[uVar25] = 0xffffffff;
            if ((((long)(this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != 4) || (str[uVar25] == uVar3)) ||
               ((str[uVar25] == 0xffffffff &&
                (bVar19 = Game::has_edge((this->super_Solver).game,uVar3,uVar3), bVar19)))) {
              str = local_80;
              piVar21 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              piVar9 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              if (piVar21 != piVar9) {
                puVar10 = (this->escapes)._bits;
                piVar28 = piVar21;
                do {
                  puVar2 = puVar10 + ((ulong)(long)*piVar28 >> 6);
                  *puVar2 = *puVar2 | 1L << ((long)*piVar28 & 0x3fU);
                  piVar28 = piVar28 + 1;
                } while (piVar28 != piVar9);
              }
              if (piVar21 != piVar9) {
                pGVar7 = (this->super_Solver).game;
                puVar10 = (this->G)._bits;
                puVar11 = (pGVar7->_owner)._bits;
                piVar28 = piVar21;
                do {
                  uVar25 = (ulong)*piVar28;
                  if ((((puVar11[uVar25 >> 6] >> (uVar25 & 0x3f) & 1) == 0 ^ (byte)local_74) & 1) ==
                      0) {
                    uVar3 = pGVar7->_outedges[pGVar7->_firstouts[uVar25]];
                    if (uVar3 != 0xffffffff) {
                      puVar12 = (this->S)._bits;
                      puVar6 = (this->tangleto).queue;
                      puVar13 = (this->escapes)._bits;
                      puVar32 = (uint *)(pGVar7->_outedges + (long)pGVar7->_firstouts[uVar25] + 1);
                      do {
                        uVar25 = (ulong)(long)(int)uVar3 >> 6;
                        if ((((puVar10[uVar25] >> ((ulong)uVar3 & 0x3f) & 1) != 0) &&
                            (uVar26 = 1L << ((ulong)uVar3 & 0x3f), (puVar12[uVar25] & uVar26) == 0))
                           && (uVar14 = puVar13[uVar25], (uVar14 & uVar26) == 0)) {
                          puVar13[uVar25] = uVar14 | uVar26;
                          iVar24 = (this->tangleto).pointer;
                          (this->tangleto).pointer = iVar24 + 1;
                          puVar6[iVar24] = uVar3;
                        }
                        uVar3 = *puVar32;
                        puVar32 = puVar32 + 1;
                      } while (uVar3 != 0xffffffff);
                    }
                  }
                  piVar28 = piVar28 + 1;
                } while (piVar28 != piVar9);
              }
              uVar25 = (ulong)(uint)(this->tangleto).pointer;
              if (((long)piVar9 - (long)piVar21 >> 2) + uVar25 < (this->escapes)._size >> 6) {
                if (uVar25 != 0) {
                  puVar6 = (this->tangleto).queue;
                  puVar10 = (this->escapes)._bits;
                  uVar26 = 0;
                  do {
                    uVar3 = puVar6[uVar26];
                    bVar23 = (byte)uVar3 & 0x3f;
                    puVar2 = puVar10 + (uVar3 >> 6);
                    *puVar2 = *puVar2 & (-2L << bVar23 | 0xfffffffffffffffeU >> 0x40 - bVar23);
                    uVar26 = uVar26 + 1;
                  } while (uVar25 != uVar26);
                }
                if (piVar21 != piVar9) {
                  puVar10 = (this->escapes)._bits;
                  do {
                    bVar23 = (byte)*piVar21 & 0x3f;
                    puVar2 = puVar10 + ((ulong)(long)*piVar21 >> 6);
                    *puVar2 = *puVar2 & (-2L << bVar23 | 0xfffffffffffffffeU >> 0x40 - bVar23);
                    piVar21 = piVar21 + 1;
                  } while (piVar21 != piVar9);
                }
              }
              else {
                sVar15 = (this->escapes)._bitssize;
                if (sVar15 != 0) {
                  memset((this->escapes)._bits,0,sVar15 << 3);
                }
              }
              if (uVar25 == 0) {
                if ((this->super_Solver).trace != 0) {
                  poVar22 = (this->super_Solver).logger;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar22,"\x1b[1;38;5;201mdominion \x1b[36m",0x1b);
                  poVar22 = (ostream *)std::ostream::operator<<(poVar22,local_94);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar22,"\x1b[m",3);
                  if (1 < (this->super_Solver).trace) {
                    piVar9 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish;
                    for (piVar21 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start; piVar21 != piVar9;
                        piVar21 = piVar21 + 1) {
                      iVar24 = *piVar21;
                      poVar22 = (this->super_Solver).logger;
                      std::__ostream_insert<char,std::char_traits<char>>(poVar22," \x1b[1;36m",8);
                      local_90.g = (this->super_Solver).game;
                      local_90.v = iVar24;
                      poVar22 = operator<<(poVar22,&local_90);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar22,"\x1b[m",3);
                      piVar28 = local_80;
                      if (local_80[iVar24] != -1) {
                        poVar22 = (this->super_Solver).logger;
                        std::__ostream_insert<char,std::char_traits<char>>(poVar22,"->",2);
                        local_90.v = piVar28[iVar24];
                        local_90.g = (this->super_Solver).game;
                        operator<<(poVar22,&local_90);
                      }
                    }
                  }
                  poVar22 = (this->super_Solver).logger;
                  cVar18 = (char)poVar22;
                  std::ios::widen((char)poVar22->_vptr_basic_ostream[-3] + cVar18);
                  std::ostream::put(cVar18);
                  std::ostream::flush();
                }
                piVar21 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                piVar9 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                if (piVar21 != piVar9) {
                  puVar10 = (this->S)._bits;
                  piVar28 = piVar21;
                  do {
                    puVar2 = puVar10 + ((ulong)(long)*piVar28 >> 6);
                    *puVar2 = *puVar2 | 1L << ((long)*piVar28 & 0x3fU);
                    piVar28 = piVar28 + 1;
                  } while (piVar28 != piVar9);
                }
                this->dominions = this->dominions + 1;
                bVar20 = true;
                iVar30 = 2;
                str = local_80;
                if (piVar9 != piVar21) goto LAB_0016ba6c;
              }
              else {
                if (0 < (this->super_Solver).trace) {
                  poVar22 = (this->super_Solver).logger;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar22,"\x1b[1;38;5;198mnew tangle ",0x18);
                  poVar22 = (ostream *)std::ostream::operator<<(poVar22,local_94);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar22,"\x1b[m (",5);
                  poVar22 = std::ostream::_M_insert<unsigned_long>((ulong)poVar22);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar22,")",1);
                  if (1 < (this->super_Solver).trace) {
                    piVar9 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish;
                    for (piVar21 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start; piVar21 != piVar9;
                        piVar21 = piVar21 + 1) {
                      iVar24 = *piVar21;
                      poVar22 = (this->super_Solver).logger;
                      std::__ostream_insert<char,std::char_traits<char>>(poVar22," \x1b[1;36m",8);
                      local_90.g = (this->super_Solver).game;
                      local_90.v = iVar24;
                      poVar22 = operator<<(poVar22,&local_90);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar22,"\x1b[m",3);
                      piVar28 = local_80;
                      if (local_80[iVar24] != -1) {
                        poVar22 = (this->super_Solver).logger;
                        std::__ostream_insert<char,std::char_traits<char>>(poVar22,"->",2);
                        local_90.v = piVar28[iVar24];
                        local_90.g = (this->super_Solver).game;
                        operator<<(poVar22,&local_90);
                      }
                    }
                  }
                  poVar22 = (this->super_Solver).logger;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar22," with ",6);
                  poVar22 = std::ostream::_M_insert<unsigned_long>((ulong)poVar22);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar22," escape vertices.",0x11);
                  poVar22 = (this->super_Solver).logger;
                  cVar18 = (char)poVar22;
                  std::ios::widen((char)poVar22->_vptr_basic_ostream[-3] + cVar18);
                  std::ostream::put(cVar18);
                  std::ostream::flush();
                  str = local_80;
                }
                local_70 = (int)((ulong)((long)(this->tpr).
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_finish -
                                        (long)(this->tpr).
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start) >> 2);
                uVar3 = (this->tangleto).pointer;
                uVar25 = (ulong)uVar3;
                if (uVar3 != 0) {
                  uVar26 = 0;
                  do {
                    this_00 = (vector<int,std::allocator<int>> *)
                              (this->tin + (this->tangleto).queue[uVar26]);
                    iVar8._M_current = *(int **)(this_00 + 8);
                    if (iVar8._M_current == *(int **)(this_00 + 0x10)) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                (this_00,iVar8,&local_70);
                    }
                    else {
                      *iVar8._M_current = local_70;
                      *(int **)(this_00 + 8) = iVar8._M_current + 1;
                    }
                    uVar26 = uVar26 + 1;
                    uVar25 = (ulong)(uint)(this->tangleto).pointer;
                  } while (uVar26 < uVar25);
                }
                local_90.g = (Game *)operator_new__((ulong)((int)uVar25 + 1) << 2);
                if ((int)uVar25 != 0) {
                  puVar6 = (this->tangleto).queue;
                  lVar29 = uVar25 + 1;
                  lVar31 = 0;
                  do {
                    *(undefined4 *)((long)&(local_90.g)->n_vertices + lVar31) =
                         *(undefined4 *)((long)puVar6 + lVar31);
                    lVar29 = lVar29 + -1;
                    lVar31 = lVar31 + 4;
                  } while (1 < lVar29);
                }
                *(int *)((long)&(local_90.g)->n_vertices + uVar25 * 4) = -1;
                iVar16._M_current =
                     (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar16._M_current ==
                    (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int*,std::allocator<int*>>::_M_realloc_insert<int*const&>
                            (local_50,iVar16,(int **)&local_90);
                }
                else {
                  *iVar16._M_current = (int *)local_90.g;
                  pppiVar1 = &(this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl
                              .super__Vector_impl_data._M_finish;
                  *pppiVar1 = *pppiVar1 + 1;
                }
                piVar21 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                piVar9 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                local_38 = (int *)operator_new__(-(ulong)(((long)piVar9 - (long)piVar21 >> 2 &
                                                          0x6000000000000000U) != 0) |
                                                 ((long)piVar9 - (long)piVar21) * 2 + 4U);
                if (piVar9 == piVar21) {
                  uVar25 = 0;
                }
                else {
                  piVar28 = local_38 + 1;
                  iVar24 = 0;
                  do {
                    iVar30 = *piVar21;
                    piVar28[-1] = iVar30;
                    *piVar28 = str[iVar30];
                    piVar21 = piVar21 + 1;
                    piVar28 = piVar28 + 2;
                    iVar24 = iVar24 + -2;
                  } while (piVar21 != piVar9);
                  uVar25 = (ulong)(uint)-iVar24;
                }
                local_38[uVar25] = -1;
                iVar16._M_current =
                     (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar16._M_current ==
                    (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int*,std::allocator<int*>>::_M_realloc_insert<int*const&>
                            (local_58,iVar16,&local_38);
                }
                else {
                  *iVar16._M_current = local_38;
                  pppiVar1 = &(this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                              super__Vector_impl_data._M_finish;
                  *pppiVar1 = *pppiVar1 + 1;
                }
                iVar8._M_current =
                     (this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar8._M_current ==
                    (this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (local_48,iVar8,&local_94);
                }
                else {
                  *iVar8._M_current = local_94;
                  (this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar8._M_current + 1;
                }
                local_6c = 0;
                __position._M_current =
                     (this->tescs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (this->tescs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                  _M_realloc_insert<unsigned_int>(local_60,__position,&local_6c);
                }
                else {
                  *__position._M_current = 0;
                  (this->tescs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
                }
                this->tangles = this->tangles + 1;
                piVar17 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if ((this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish != piVar17) {
                  (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = piVar17;
                }
                (this->tangleto).pointer = 0;
                bVar20 = true;
                iVar30 = 0;
              }
            }
            else {
              piVar21 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              iVar30 = 2;
              if ((this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish != piVar21) {
LAB_0016ba6c:
                iVar30 = 2;
                (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = piVar21;
              }
            }
          }
        }
      }
    } while ((iVar30 == 4) || ((this->pea_state).pointer != 0));
  }
  (this->pea_S).pointer = 0;
  return bVar20;
}

Assistant:

bool
TLSolver::extractTangles(int startvertex, bitset &R, int *str)
{
    bool new_tangles = false;
    const int pr = priority(startvertex);
    const int pl = pr&1;

    /**
     * The following is the nonrecursive implementation of David Pearce,
     * "A space-efficient algorithm for finding strongly connected components" (IPL, 2016),
     * modified to on-the-fly restrict the graph by <R> and <str>.
     */

    // beginVisiting
    pea_state.push(startvertex);
    pea_state.push(0);
    pea_root[startvertex] = true;
    pea_vidx[startvertex] = pea_curidx++;
    while (pea_state.nonempty()) {
pearce_again:
        // visitLoop
        const unsigned int n = pea_state.back2();
        unsigned int i = pea_state.back();

        if (owner(n) != pl) {
            auto edges = outs(n);
            if (i>0) {
                // finishEdge
                const int w = edges[i-1];
                if (pea_vidx[w] < pea_vidx[n]) {
                    pea_vidx[n] = pea_vidx[w];
                    pea_root[n] = false;
                }
            }
            for (;;) {
                const int to = edges[i];
                if (to == -1) break; // done
                // beginEdge
                if (R[to]) {
                    if (pea_vidx[to] == 0) {
                        pea_state.back() = i+1;
                        // beginVisiting
                        pea_state.push(to);
                        pea_state.push(0);
                        pea_root[to] = true;
                        pea_vidx[to] = pea_curidx++;
                        goto pearce_again; // break; continue;
                    } else {
                        // finishEdge
                        if (pea_vidx[to] < pea_vidx[n]) {
                            pea_vidx[n] = pea_vidx[to];
                            pea_root[n] = false;
                        }
                    }
                }
                i++;
            }
        } else {
            const int s = str[n];
            if (i == 0) {
                // beginEdge
                if (pea_vidx[s] == 0) {
                    pea_state.back() = 1;
                    // beginVisiting
                    pea_state.push(s);
                    pea_state.push(0);
                    pea_root[s] = true;
                    pea_vidx[s] = pea_curidx++;
                    goto pearce_again; // break; continue;
                }
            }
            // finishEdge
            if (pea_vidx[s] < pea_vidx[n]) {
                pea_vidx[n] = pea_vidx[s];
                pea_root[n] = false;
            }
        }
        // finishVisiting
        pea_state.pop2();
        if (pea_root[n]) {
            pea_curidx -= 1;
            tangle.push_back(n);
            while (pea_S.nonempty()) {
                const int t = pea_S.back();
                if (pea_vidx[n]>pea_vidx[t]) break;
                pea_S.pop();
                pea_curidx -= 1;
                pea_vidx[t] = (unsigned int)-1;
                tangle.push_back(t);
            }
            pea_vidx[n] = (unsigned int)-1;
        } else {
            pea_S.push(n);
            continue;
        }

        /**
         * End of Pearce's algorithm.
         * At this point, we have an SCC in <tangle>.
         *
         * Now check if the SCC is nontrivial, i.e., contains a cycle, i.e., either 2+ vertices
         * or a self-loop.
         */

        const bool is_not_tangle = (tangle.size() == 1) and
            ((unsigned int)str[n] != n) and (str[n] != -1 or !game.has_edge(n, n));
        if (is_not_tangle) {
            // std::cout << "not a tangle: " << pea_vidx[n] << std::endl;
            tangle.clear();
            continue;
        }

        /**
         * We have a tangle. Compute the outgoing edges (into <tangleto>) and the next highest region.
         */

        for (const int v : tangle) escapes[v] = true;

        for (const int v : tangle) {
            if (owner(v) != pl) {
                for (auto curedge = outs(v); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (G[to] and !S[to] && !escapes[to]) {
                        escapes[to] = true;
                        tangleto.push(to);
                    }
                }
            }
        }

        if ((tangle.size()+tangleto.size()) < (escapes.size()/64)) {
            for (unsigned int x = 0; x < tangleto.size(); x++) escapes[tangleto[x]] = false;
            for (const int v : tangle) escapes[v] = false;
        } else {
            escapes.reset(); // this is very expensive on large practical games with many small tangles
        }

        /**
         * If there are no outgoing edges, then we have found a dominion.
         */

        if (tangleto.empty()) {
            // dominion
#ifndef NDEBUG
            if (trace) {
                logger << "\033[1;38;5;201mdominion \033[36m" << pr << "\033[m";
                if (trace >= 2) {
                    for (const int v : tangle) {
                        logger << " \033[1;36m" << label_vertex(v) << "\033[m";
                        if (str[v] != -1) logger << "->" << label_vertex(str[v]);
                    }
                }
                logger << std::endl;
            }
#endif
            for (const int v : tangle) S[v] = true;
            dominions++;
            tangle.clear();
            new_tangles = true;
            continue;
        }

        /**
         * We're not a dominion, we're a tangle.
         */

#ifndef NDEBUG
        if (trace >= 1) {
            logger << "\033[1;38;5;198mnew tangle " << pr << "\033[m (" << tpr.size() << ")";
            if (trace >= 2) {
                for (const int v : tangle) {
                    logger << " \033[1;36m" << label_vertex(v) << "\033[m";
                    if (str[v] != -1) logger << "->" << label_vertex(str[v]);
                }
            }
            logger << " with " << tangleto.size() << " escape vertices.";
            logger << std::endl;
        }
#endif

        // new tangle idx
        const int tidx = tpr.size();

        // add back links to all normal vertices in our [out]
        for (unsigned int x = 0; x < tangleto.size(); x++) tin[tangleto[x]].push_back(tidx);

        // move tangleto into vout
        int* _tout = new int[tangleto.size()+1];
        std::copy(&tangleto[0], &tangleto[tangleto.size()], _tout);
        _tout[tangleto.size()] = -1;
        tout.push_back(_tout);

        // move tangle into vv
        int* _vv = new int[tangle.size()*2+1], c=0;
        for (const int v : tangle) {
            _vv[c++] = v;
            _vv[c++] = str[v];
        }
        _vv[c] = -1;
        tv.push_back(_vv);

        // and set p to pr
        tpr.push_back(pr);
        tescs.push_back(0);

        tangles++;
        tangle.clear();
        tangleto.clear();
        new_tangles = true;
    }

    pea_S.clear();
    return new_tangles;
}